

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  MessageGenerator *pMVar1;
  ExtensionGenerator *pEVar2;
  GeneratorFactory *pGVar3;
  ClassNameResolver *this_00;
  int iVar4;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar5;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *psVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  FileDescriptor *pFVar9;
  char *__function;
  _Link_type __x;
  long lVar10;
  _Self __tmp;
  int bytecode_estimate;
  int method_num;
  string file_data;
  string dependency;
  FieldDescriptorSet extensions;
  FileDescriptorProto file_proto;
  SharedCodeGenerator shared_code_generator;
  int local_1d8 [2];
  string local_1d0;
  string local_1b0;
  FieldDescriptorSet local_190;
  undefined1 local_160 [216];
  SharedCodeGenerator local_88;
  undefined4 extraout_var;
  
  local_160._0_8_ = local_160 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"");
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                     ,"final",(string *)local_160);
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  io::Printer::Indent(printer);
  SharedCodeGenerator::SharedCodeGenerator(&local_88,this->file_,&this->options_);
  SharedCodeGenerator::GenerateDescriptors(&local_88,printer);
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  pFVar9 = this->file_;
  if (0 < *(int *)(pFVar9 + 0x58)) {
    lVar10 = 0;
    do {
      psVar5 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar10);
      pMVar1 = psVar5->ptr_;
      if (pMVar1 == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->() const [C = google::protobuf::compiler::java::MessageGenerator]"
        ;
        goto LAB_0026a941;
      }
      iVar4 = (*pMVar1->_vptr_MessageGenerator[3])(pMVar1,printer);
      local_1d8[0] = local_1d8[0] + iVar4;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar10 = lVar10 + 1;
      pFVar9 = this->file_;
    } while (lVar10 < *(int *)(pFVar9 + 0x58));
  }
  if (0 < *(int *)(pFVar9 + 0x88)) {
    lVar10 = 0;
    do {
      psVar6 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar10);
      pEVar2 = psVar6->ptr_;
      if (pEVar2 == (ExtensionGenerator *)0x0) goto LAB_0026a8fe;
      iVar4 = (*pEVar2->_vptr_ExtensionGenerator[3])(pEVar2,printer);
      local_1d8[0] = local_1d8[0] + iVar4;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
                 "private static void _clinit_autosplit_dinit_$method_num$() {\n");
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this->file_ + 0x88));
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_160);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_160);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)local_160,&local_1d0);
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  anon_unknown_0::CollectExtensions
            ((FileDescriptorProto *)local_160,*(DescriptorPool **)(this->file_ + 0x10),&local_190,
             &local_1d0);
  if (local_190._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    io::Printer::Print(printer,
                       "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
                      );
    if ((_Rb_tree_header *)local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_190._M_t._M_impl.super__Rb_tree_header) {
      p_Var8 = local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pGVar3 = (this->generator_factory_).ptr_;
        if (pGVar3 == (GeneratorFactory *)0x0) {
          __function = 
          "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->() const [C = google::protobuf::compiler::java::GeneratorFactory]"
          ;
          goto LAB_0026a941;
        }
        iVar4 = (*pGVar3->_vptr_GeneratorFactory[3])(pGVar3,*(undefined8 *)(p_Var8 + 1));
        plVar7 = (long *)CONCAT44(extraout_var,iVar4);
        if (plVar7 == (long *)0x0) goto LAB_0026a8fe;
        iVar4 = (**(code **)(*plVar7 + 0x20))(plVar7,printer);
        local_1d8[0] = local_1d8[0] + iVar4;
        anon_unknown_0::MaybeRestartJavaMethod
                  (printer,local_1d8,local_1d8 + 1,
                   "_clinit_autosplit_dinit_$method_num$(registry);\n",
                   "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                  );
        (**(code **)(*plVar7 + 8))(plVar7);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_190._M_t._M_impl.super__Rb_tree_header);
    }
    io::Printer::Print(printer,
                       "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
                      );
  }
  pFVar9 = this->file_;
  if (0 < *(int *)(pFVar9 + 0x18)) {
    iVar4 = 0;
    do {
      FileDescriptor::dependency(pFVar9,iVar4);
      this_00 = this->name_resolver_;
      pFVar9 = FileDescriptor::dependency(this->file_,iVar4);
      ClassNameResolver::GetClassName_abi_cxx11_(&local_1b0,this_00,pFVar9,true);
      io::Printer::Print(printer,"$dependency$.getDescriptor();\n","dependency",&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = iVar4 + 1;
      pFVar9 = this->file_;
    } while (iVar4 < *(int *)(pFVar9 + 0x18));
  }
  io::Printer::Outdent(printer);
  __x = (_Link_type)0x3942bb;
  io::Printer::Print(printer,"}\n");
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::_M_erase((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,
                    CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                             local_1d0.field_2._M_local_buf[0]) + 1);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_160);
  SharedCodeGenerator::~SharedCodeGenerator(&local_88);
  return;
LAB_0026a8fe:
  __function = 
  "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->() const [C = google::protobuf::compiler::java::ExtensionGenerator]"
  ;
LAB_0026a941:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,__function);
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n",
    // TODO(dweis): Mark this as final.
    "final", "");
  printer->Indent();

  SharedCodeGenerator shared_code_generator(file_, options_);
  shared_code_generator.GenerateDescriptors(printer);

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate += extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
      "com.google.protobuf.ExtensionRegistry registry =\n"
      "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (it = extensions.begin(); it != extensions.end(); it++) {
      google::protobuf::scoped_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(*it));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$(registry);\n",
        "private static void _clinit_autosplit_dinit_$method_num$(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
      "com.google.protobuf.Descriptors.FileDescriptor\n"
      "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}